

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O3

NodeText * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeNodeTextWithoutNested
          (NodeText *__return_storage_ptr__,CapnpcCppMain *this,StringPtr namespace_,StringPtr scope
          ,StringPtr name,Schema schema,Array<kj::StringTree> *nestedTypeDecls,
          TemplateContext *templateContext)

{
  size_type sVar1;
  size_type sVar2;
  undefined8 *puVar3;
  Reader proto_00;
  Reader proto_01;
  Array<kj::StringTree> nestedTypeDecls_00;
  Array<kj::StringTree> nestedTypeDecls_01;
  Reader value;
  Reader value_00;
  char *pcVar4;
  EnumSchema EVar5;
  SegmentReader *pSVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Which WVar9;
  int iVar10;
  uint32_t uVar11;
  Branch *pBVar12;
  StructSchema schema_00;
  NodeText *extraout_RAX;
  NodeText *pNVar13;
  Schema SVar14;
  InterfaceSchema schema_01;
  NodeText *extraout_RAX_00;
  StringTree *pSVar15;
  undefined4 extraout_var;
  NodeText *extraout_RAX_01;
  undefined4 uVar16;
  size_t sVar17;
  uint *params_1;
  char *pcVar18;
  char *pcVar19;
  StringTree *pSVar20;
  uint64_t annotationId;
  anon_union_8_2_eba6ea51_for_Type_5 aVar21;
  CppTypeName *value_02;
  CppTypeName *extraout_RDX;
  CppTypeName *extraout_RDX_00;
  CppTypeName *extraout_RDX_01;
  CppTypeName *extraout_RDX_02;
  CppTypeName *extraout_RDX_03;
  CppTypeName *extraout_RDX_04;
  CppTypeName *extraout_RDX_05;
  CppTypeName *pCVar22;
  StringTree *ptrCopy;
  ulong capacity;
  ElementCount index;
  unsigned_long uVar23;
  CapnpcCppMain *this_00;
  size_type *psVar24;
  bool bVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  StringPtr name_00;
  StringPtr scope_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  Type TVar30;
  StringPtr SVar31;
  ReaderFor<capnp::Text> RVar32;
  ReaderFor<capnp::Data> RVar33;
  ArrayDisposer *pAVar34;
  ArrayPtr<const_char> *pAVar35;
  char (*pacVar36) [3];
  char (*pacVar37) [4];
  undefined7 in_stack_fffffffffffffb88;
  undefined1 in_stack_fffffffffffffb8f;
  size_t sVar38;
  String constType;
  String constType_3;
  WirePointer *local_410;
  Branch *pBStack_408;
  size_t sStack_400;
  ArrayDisposer *pAStack_3f8;
  String upperCase;
  StringTree local_3c8;
  char *local_378;
  size_t local_370;
  String constType_1;
  WirePointer *local_350;
  Branch *pBStack_348;
  size_t sStack_340;
  ArrayDisposer *pAStack_338;
  bool local_32f;
  undefined1 local_328 [16];
  Array<kj::StringTree> result;
  ArrayDisposer *local_300;
  Branch *local_2f8;
  size_t sStack_2f0;
  ArrayDisposer *local_2e8;
  Schema schema_local;
  char *linkage;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  StructText structText;
  Type type;
  EnumerantList enumerants;
  undefined1 local_140 [16];
  Reader proto_1;
  undefined1 local_100 [24];
  ArrayDisposer *pAStack_e8;
  Branch *local_e0;
  size_t sStack_d8;
  ArrayDisposer *local_d0;
  size_t sStack_c8;
  size_type local_b8;
  size_type sStack_b0;
  undefined8 *local_a8;
  size_type local_98;
  size_type sStack_90;
  undefined8 *local_88;
  CappedArray<char,_17UL> hexId;
  Reader proto;
  CppTypeName *value_01;
  
  psVar24 = (size_type *)scope.content.size_;
  schema_local.raw = (RawBrandedSchema *)scope.content.ptr;
  sVar17 = namespace_.content.size_;
  SVar31.content.ptr = namespace_.content.ptr;
  Schema::getProto(&proto,&schema_local);
  proto_00._reader.pointerCount = proto._reader.pointerCount;
  proto_00._reader._38_2_ = proto._reader._38_2_;
  proto_00._reader.dataSize = proto._reader.dataSize;
  proto_00._reader.capTable = proto._reader.capTable;
  proto_00._reader.segment = proto._reader.segment;
  proto_00._reader.data = proto._reader.data;
  proto_00._reader.pointers = proto._reader.pointers;
  proto_00._reader.nestingLimit = proto._reader.nestingLimit;
  proto_00._reader._44_4_ = proto._reader._44_4_;
  annotationValue<capnp::schema::Node::Reader>
            ((Maybe<capnp::schema::Value::Reader> *)&structText,(CapnpcCppMain *)0xf264a779fef191ce,
             proto_00,annotationId);
  if ((char)structText.outerTypeDecl.size_ != '\0') {
    bVar25 = structText.outerTypeDecl.branches.size_._4_2_ == 0;
    pBVar12 = structText.outerTypeDecl.branches.ptr;
    if (bVar25) {
      pBVar12 = (Branch *)0x0;
    }
    uVar16 = 0x7fffffff;
    if (!bVar25) {
      uVar16 = structText.outerTypeDecl.branches.disposer._0_4_;
    }
    uVar26 = 0;
    uVar27 = 0;
    uVar28 = 0;
    uVar29 = 0;
    if (!bVar25) {
      uVar26 = structText.outerTypeDecl.text.content.ptr._0_4_;
      uVar27 = structText.outerTypeDecl.text.content.ptr._4_4_;
      uVar28 = (undefined4)structText.outerTypeDecl.text.content.size_;
      uVar29 = structText.outerTypeDecl.text.content.size_._4_4_;
    }
    structText.outerTypeDecl.size_ = CONCAT44(uVar27,uVar26);
    structText.outerTypeDecl.text.content.ptr = (char *)CONCAT44(uVar29,uVar28);
    structText.outerTypeDecl.text.content.disposer =
         (ArrayDisposer *)CONCAT44(structText.outerTypeDecl.text.content.disposer._4_4_,uVar16);
    structText.outerTypeDecl.text.content.size_ = (size_t)pBVar12;
    name.content = (ArrayPtr<const_char>)
                   _::PointerReader::getBlob<capnp::Text>
                             ((PointerReader *)&structText,(void *)0x0,0);
  }
  if (proto._reader.dataSize < 0x40) {
    uVar23 = 0;
  }
  else {
    uVar23 = *proto._reader.data;
  }
  pNVar13 = __return_storage_ptr__;
  kj::hex(&hexId,uVar23);
  if (proto._reader.dataSize < 0x70) {
switchD_0015edb0_caseD_0:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[47]>
              ((Fault *)&structText,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnpc-c++.c++"
               ,0xafd,FAILED,(char *)0x0,"\"This method shouldn\'t be called on file nodes.\"",
               (char (*) [47])"This method shouldn\'t be called on file nodes.");
    kj::_::Debug::Fault::fatal((Fault *)&structText);
  }
  pcVar18 = name.content.ptr;
  sVar38 = name.content.size_;
  switch(*(undefined2 *)((long)proto._reader.data + 0xc)) {
  case 0:
    goto switchD_0015edb0_caseD_0;
  case 1:
    pAVar34 = (ArrayDisposer *)0x15edcb;
    schema_00 = Schema::asStruct(&schema_local);
    sVar1 = *psVar24;
    sVar2 = psVar24[1];
    puVar3 = (undefined8 *)psVar24[2];
    *psVar24 = 0;
    psVar24[1] = 0;
    nestedTypeDecls_00.size_ = (size_t)schema.raw;
    nestedTypeDecls_00.ptr = (StringTree *)&local_98;
    nestedTypeDecls_00.disposer = pAVar34;
    SVar31.content.size_ = sVar17;
    name_02.content.size_ = sVar38;
    name_02.content.ptr = pcVar18;
    local_98 = sVar1;
    sStack_90 = sVar2;
    local_88 = puVar3;
    makeStructText(&structText,this,SVar31,name_02,schema_00,nestedTypeDecls_00,
                   (TemplateContext *)CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88))
    ;
    if (sVar1 != 0) {
      local_98 = 0;
      sStack_90 = 0;
      (**(code **)*puVar3)
                (puVar3,sVar1,0x38,sVar2,sVar2,
                 kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    }
    (pNVar13->outerTypeDecl).size_ = structText.outerTypeDecl.size_;
    (pNVar13->outerTypeDecl).text.content.ptr = structText.outerTypeDecl.text.content.ptr;
    (pNVar13->outerTypeDecl).text.content.size_ = structText.outerTypeDecl.text.content.size_;
    structText.outerTypeDecl.text.content.ptr = (char *)0x0;
    structText.outerTypeDecl.text.content.size_ = 0;
    (pNVar13->outerTypeDecl).text.content.disposer = structText.outerTypeDecl.text.content.disposer;
    (pNVar13->outerTypeDecl).branches.ptr = structText.outerTypeDecl.branches.ptr;
    (pNVar13->outerTypeDecl).branches.size_ = structText.outerTypeDecl.branches.size_;
    (pNVar13->outerTypeDecl).branches.disposer = structText.outerTypeDecl.branches.disposer;
    structText.outerTypeDecl.branches.ptr = (Branch *)0x0;
    structText.outerTypeDecl.branches.size_ = 0;
    (pNVar13->outerTypeDef).size_ = structText.outerTypeDef.size_;
    (pNVar13->outerTypeDef).text.content.ptr = structText.outerTypeDef.text.content.ptr;
    (pNVar13->outerTypeDef).text.content.size_ = structText.outerTypeDef.text.content.size_;
    structText.outerTypeDef.text.content.ptr = (char *)0x0;
    structText.outerTypeDef.text.content.size_ = 0;
    (pNVar13->outerTypeDef).text.content.disposer = structText.outerTypeDef.text.content.disposer;
    (pNVar13->outerTypeDef).branches.ptr = structText.outerTypeDef.branches.ptr;
    (pNVar13->outerTypeDef).branches.size_ = structText.outerTypeDef.branches.size_;
    (pNVar13->outerTypeDef).branches.disposer = structText.outerTypeDef.branches.disposer;
    structText.outerTypeDef.branches.ptr = (Branch *)0x0;
    structText.outerTypeDef.branches.size_ = 0;
    (pNVar13->readerBuilderDefs).size_ = structText.readerBuilderDefs.size_;
    (pNVar13->readerBuilderDefs).text.content.ptr = structText.readerBuilderDefs.text.content.ptr;
    (pNVar13->readerBuilderDefs).text.content.size_ =
         structText.readerBuilderDefs.text.content.size_;
    structText.readerBuilderDefs.text.content.ptr = (char *)0x0;
    structText.readerBuilderDefs.text.content.size_ = 0;
    (pNVar13->readerBuilderDefs).text.content.disposer =
         structText.readerBuilderDefs.text.content.disposer;
    (pNVar13->readerBuilderDefs).branches.ptr = structText.readerBuilderDefs.branches.ptr;
    (pNVar13->readerBuilderDefs).branches.size_ = structText.readerBuilderDefs.branches.size_;
    (pNVar13->readerBuilderDefs).branches.disposer = structText.readerBuilderDefs.branches.disposer;
    structText.readerBuilderDefs.branches.ptr = (Branch *)0x0;
    structText.readerBuilderDefs.branches.size_ = 0;
    (pNVar13->inlineMethodDefs).size_ = structText.inlineMethodDefs.size_;
    (pNVar13->inlineMethodDefs).text.content.ptr = structText.inlineMethodDefs.text.content.ptr;
    (pNVar13->inlineMethodDefs).text.content.size_ = structText.inlineMethodDefs.text.content.size_;
    structText.inlineMethodDefs.text.content.ptr = (char *)0x0;
    structText.inlineMethodDefs.text.content.size_ = 0;
    (pNVar13->inlineMethodDefs).text.content.disposer =
         structText.inlineMethodDefs.text.content.disposer;
    (pNVar13->inlineMethodDefs).branches.ptr = structText.inlineMethodDefs.branches.ptr;
    (pNVar13->inlineMethodDefs).branches.size_ = structText.inlineMethodDefs.branches.size_;
    (pNVar13->inlineMethodDefs).branches.disposer = structText.inlineMethodDefs.branches.disposer;
    structText.inlineMethodDefs.branches.ptr = (Branch *)0x0;
    structText.inlineMethodDefs.branches.size_ = 0;
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    (pNVar13->sourceFileDefs).size_ = structText.sourceDefs.size_;
    (pNVar13->sourceFileDefs).text.content.ptr = structText.sourceDefs.text.content.ptr;
    (pNVar13->sourceFileDefs).text.content.size_ = structText.sourceDefs.text.content.size_;
    structText.sourceDefs.text.content.ptr = (char *)0x0;
    structText.sourceDefs.text.content.size_ = 0;
    (pNVar13->sourceFileDefs).text.content.disposer = structText.sourceDefs.text.content.disposer;
    (pNVar13->sourceFileDefs).branches.ptr = structText.sourceDefs.branches.ptr;
    (pNVar13->sourceFileDefs).branches.size_ = structText.sourceDefs.branches.size_;
    (pNVar13->sourceFileDefs).branches.disposer = structText.sourceDefs.branches.disposer;
    structText.sourceDefs.branches.ptr = (Branch *)0x0;
    structText.sourceDefs.branches.size_ = 0;
    StructText::~StructText(&structText);
    pNVar13 = extraout_RAX;
    break;
  case 2:
    structText.outerTypeDecl.size_ = (size_t)Schema::asEnum(&schema_local);
    EnumSchema::getEnumerants(&enumerants,(EnumSchema *)&structText);
    if (sVar17 == 1) {
      kj::StringTree::concat<>();
      kj::
      strTree<char_const(&)[27],kj::StringPtr&,char_const(&)[2],kj::CappedArray<char,17ul>&,char_const(&)[2],kj::StringPtr&,char_const(&)[4]>
                (&__return_storage_ptr__->outerTypeDef,(kj *)0x22116c,(char (*) [27])&name,
                 (StringPtr *)0x220d68,(char (*) [2])&hexId,(CappedArray<char,_17UL> *)0x220bfd,
                 (char (*) [2])&name,(StringPtr *)0x2214fc,
                 (char (*) [4])CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88));
    }
    else {
      kj::
      strTree<char_const(&)[29],kj::StringPtr&,char_const(&)[2],kj::CappedArray<char,17ul>&,char_const(&)[2],kj::StringPtr&,char_const(&)[4]>
                (&__return_storage_ptr__->outerTypeDecl,(kj *)"  typedef ::capnp::schemas::",
                 (char (*) [29])&name,(StringPtr *)0x220d68,(char (*) [2])&hexId,
                 (CappedArray<char,_17UL> *)0x220bfd,(char (*) [2])&name,(StringPtr *)0x2214fc,
                 (char (*) [4])CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88));
      kj::StringTree::concat<>();
    }
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    capacity = enumerants.list.reader._24_8_ & 0xffffffff;
    pacVar36 = (char (*) [3])0x0;
    pSVar15 = (StringTree *)
              kj::_::HeapArrayDisposer::allocateImpl
                        (0x38,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    constType_1.content.disposer = (ArrayDisposer *)(pSVar15 + capacity);
    pcVar18 = (char *)&kj::_::HeapArrayDisposer::instance;
    pSVar20 = pSVar15;
    constType_1.content.ptr = (char *)pSVar15;
    if (enumerants.list.reader.elementCount != 0) {
      index = 0;
      do {
        EVar5.super_Schema.raw = enumerants.parent.super_Schema.raw;
        this_00 = (CapnpcCppMain *)(local_100 + 0x10);
        constType_1.content.size_ = (size_t)pSVar15;
        _::ListReader::getStructElement((StructReader *)this_00,&enumerants.list.reader,index);
        uVar7 = local_100._8_8_;
        local_100._0_8_ = EVar5.super_Schema.raw;
        local_100._8_2_ = (short)index;
        uVar8 = local_100._8_8_;
        structText.outerTypeDecl.branches.disposer = local_d0;
        structText.outerTypeDef.size_ = sStack_c8;
        structText.outerTypeDecl.branches.ptr = local_e0;
        structText.outerTypeDecl.branches.size_ = sStack_d8;
        structText.outerTypeDecl.text.content.size_ = local_100._16_8_;
        structText.outerTypeDecl.text.content.disposer = pAStack_e8;
        structText.outerTypeDecl.size_ = (size_t)EVar5.super_Schema.raw;
        local_100._10_4_ = SUB84(uVar7,2);
        local_100._14_2_ = SUB82(uVar7,6);
        structText.outerTypeDecl.text.content.ptr =
             (char *)CONCAT26(local_100._14_2_,CONCAT42(local_100._10_4_,(short)index));
        proto_01._reader.capTable = (CapTableReader *)pAStack_e8;
        proto_01._reader.segment = (SegmentReader *)local_100._16_8_;
        proto_01._reader.data = local_e0;
        proto_01._reader.pointers = (WirePointer *)sStack_d8;
        proto_01._reader._32_8_ = local_d0;
        proto_01._reader._40_8_ = sStack_c8;
        local_100._8_8_ = uVar8;
        SVar31 = protoName<capnp::schema::Enumerant::Reader>(this_00,proto_01);
        name_01.content.ptr = (char *)SVar31.content.size_;
        name_01.content.size_ = (size_t)pcVar18;
        toUpperCase(&constType_3,(CapnpcCppMain *)SVar31.content.ptr,name_01);
        pcVar18 = ",\n";
        kj::strTree<char_const(&)[3],kj::String,char_const(&)[3]>
                  (&local_3c8,(kj *)0x220bfc,(char (*) [3])&constType_3,(String *)0x2222a8,pacVar36)
        ;
        pcVar19 = (char *)constType_3.content.size_;
        pcVar4 = constType_3.content.ptr;
        if (constType_3.content.ptr != (char *)0x0) {
          constType_3.content.ptr = (char *)0x0;
          constType_3.content.size_ = 0;
          pacVar36 = (char (*) [3])pcVar19;
          (**(constType_3.content.disposer)->_vptr_ArrayDisposer)
                    (constType_3.content.disposer,pcVar4,1,pcVar19,pcVar19,0);
          pcVar18 = pcVar19;
        }
        pSVar15->size_ = local_3c8.size_;
        (pSVar15->text).content.ptr = local_3c8.text.content.ptr;
        (pSVar15->text).content.size_ = local_3c8.text.content.size_;
        local_3c8.text.content.ptr = (char *)0x0;
        local_3c8.text.content.size_ = 0;
        (pSVar15->text).content.disposer = local_3c8.text.content.disposer;
        (pSVar15->branches).ptr = local_3c8.branches.ptr;
        (pSVar15->branches).size_ = local_3c8.branches.size_;
        (pSVar15->branches).disposer = local_3c8.branches.disposer;
        pSVar15 = pSVar15 + 1;
        index = index + 1;
      } while (index != enumerants.list.reader.elementCount);
    }
    result.size_ = ((long)pSVar15 - (long)pSVar20 >> 3) * 0x6db6db6db6db6db7;
    result.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    constType_1.content.size_ = (size_t)pSVar15;
    result.ptr = pSVar20;
    kj::
    strTree<char_const(&)[12],kj::StringPtr&,char_const(&)[2],kj::CappedArray<char,17ul>&,char_const(&)[14],kj::Array<kj::StringTree>,char_const(&)[23],kj::StringPtr&,char_const(&)[3],kj::CappedArray<char,17ul>&,char_const(&)[4]>
              (&pNVar13->capnpSchemaDecls,(kj *)"enum class ",(char (*) [12])&name,
               (StringPtr *)0x220d68,(char (*) [2])&hexId,(CappedArray<char,_17UL> *)0x2213dc,
               (char (*) [14])&result,(Array<kj::StringTree> *)"};\nCAPNP_DECLARE_ENUM(",
               (char (*) [23])&name,(StringPtr *)0x22212e,(char (*) [3])&hexId,
               (CappedArray<char,_17UL> *)0x222113,
               (char (*) [4])CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88));
    kj::
    strTree<char_const(&)[19],kj::StringPtr&,char_const(&)[2],kj::CappedArray<char,17ul>&,char_const(&)[3],kj::CappedArray<char,17ul>&,char_const(&)[4]>
              (&pNVar13->capnpSchemaDefs,(kj *)"CAPNP_DEFINE_ENUM(",(char (*) [19])&name,
               (StringPtr *)0x220d68,(char (*) [2])&hexId,(CappedArray<char,_17UL> *)0x22212e,
               (char (*) [3])&hexId,(CappedArray<char,_17UL> *)0x222113,
               (char (*) [4])CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88));
    pNVar13 = (NodeText *)kj::StringTree::concat<>();
    sVar17 = result.size_;
    pSVar20 = result.ptr;
    if (result.ptr != (StringTree *)0x0) {
      result.ptr = (StringTree *)0x0;
      result.size_ = 0;
      iVar10 = (**(result.disposer)->_vptr_ArrayDisposer)
                         (result.disposer,pSVar20,0x38,sVar17,sVar17,
                          kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
      pNVar13 = (NodeText *)CONCAT44(extraout_var,iVar10);
    }
    break;
  case 3:
    this->hasInterfaces = true;
    pAVar34 = (ArrayDisposer *)0x15f2bb;
    schema_01 = Schema::asInterface(&schema_local);
    sVar1 = *psVar24;
    sVar2 = psVar24[1];
    puVar3 = (undefined8 *)psVar24[2];
    *psVar24 = 0;
    psVar24[1] = 0;
    nestedTypeDecls_01.size_ = (size_t)schema.raw;
    nestedTypeDecls_01.ptr = (StringTree *)&local_b8;
    nestedTypeDecls_01.disposer = pAVar34;
    scope_00.content.size_ = sVar17;
    scope_00.content.ptr = SVar31.content.ptr;
    name_03.content.size_ = sVar38;
    name_03.content.ptr = pcVar18;
    local_b8 = sVar1;
    sStack_b0 = sVar2;
    local_a8 = puVar3;
    makeInterfaceText((InterfaceText *)&structText,this,scope_00,name_03,schema_01,
                      nestedTypeDecls_01,
                      (TemplateContext *)
                      CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88));
    if (sVar1 != 0) {
      local_b8 = 0;
      sStack_b0 = 0;
      (**(code **)*puVar3)
                (puVar3,sVar1,0x38,sVar2,sVar2,
                 kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    }
    (pNVar13->outerTypeDecl).size_ = structText.outerTypeDecl.size_;
    (pNVar13->outerTypeDecl).text.content.ptr = structText.outerTypeDecl.text.content.ptr;
    (pNVar13->outerTypeDecl).text.content.size_ = structText.outerTypeDecl.text.content.size_;
    structText.outerTypeDecl.text.content.ptr = (char *)0x0;
    structText.outerTypeDecl.text.content.size_ = 0;
    (pNVar13->outerTypeDecl).text.content.disposer = structText.outerTypeDecl.text.content.disposer;
    (pNVar13->outerTypeDecl).branches.ptr = structText.outerTypeDecl.branches.ptr;
    (pNVar13->outerTypeDecl).branches.size_ = structText.outerTypeDecl.branches.size_;
    (pNVar13->outerTypeDecl).branches.disposer = structText.outerTypeDecl.branches.disposer;
    structText.outerTypeDecl.branches.ptr = (Branch *)0x0;
    structText.outerTypeDecl.branches.size_ = 0;
    (pNVar13->outerTypeDef).size_ = structText.outerTypeDef.size_;
    (pNVar13->outerTypeDef).text.content.ptr = structText.outerTypeDef.text.content.ptr;
    (pNVar13->outerTypeDef).text.content.size_ = structText.outerTypeDef.text.content.size_;
    structText.outerTypeDef.text.content.ptr = (char *)0x0;
    structText.outerTypeDef.text.content.size_ = 0;
    (pNVar13->outerTypeDef).text.content.disposer = structText.outerTypeDef.text.content.disposer;
    (pNVar13->outerTypeDef).branches.ptr = structText.outerTypeDef.branches.ptr;
    (pNVar13->outerTypeDef).branches.size_ = structText.outerTypeDef.branches.size_;
    (pNVar13->outerTypeDef).branches.disposer = structText.outerTypeDef.branches.disposer;
    structText.outerTypeDef.branches.ptr = (Branch *)0x0;
    structText.outerTypeDef.branches.size_ = 0;
    (pNVar13->readerBuilderDefs).size_ = structText.readerBuilderDefs.size_;
    (pNVar13->readerBuilderDefs).text.content.ptr = structText.readerBuilderDefs.text.content.ptr;
    (pNVar13->readerBuilderDefs).text.content.size_ =
         structText.readerBuilderDefs.text.content.size_;
    structText.readerBuilderDefs.text.content.ptr = (char *)0x0;
    structText.readerBuilderDefs.text.content.size_ = 0;
    (pNVar13->readerBuilderDefs).text.content.disposer =
         structText.readerBuilderDefs.text.content.disposer;
    (pNVar13->readerBuilderDefs).branches.ptr = structText.readerBuilderDefs.branches.ptr;
    (pNVar13->readerBuilderDefs).branches.size_ = structText.readerBuilderDefs.branches.size_;
    (pNVar13->readerBuilderDefs).branches.disposer = structText.readerBuilderDefs.branches.disposer;
    structText.readerBuilderDefs.branches.ptr = (Branch *)0x0;
    structText.readerBuilderDefs.branches.size_ = 0;
    (pNVar13->inlineMethodDefs).size_ = structText.inlineMethodDefs.size_;
    (pNVar13->inlineMethodDefs).text.content.ptr = structText.inlineMethodDefs.text.content.ptr;
    (pNVar13->inlineMethodDefs).text.content.size_ = structText.inlineMethodDefs.text.content.size_;
    structText.inlineMethodDefs.text.content.ptr = (char *)0x0;
    structText.inlineMethodDefs.text.content.size_ = 0;
    (pNVar13->inlineMethodDefs).text.content.disposer =
         structText.inlineMethodDefs.text.content.disposer;
    (pNVar13->inlineMethodDefs).branches.ptr = structText.inlineMethodDefs.branches.ptr;
    (pNVar13->inlineMethodDefs).branches.size_ = structText.inlineMethodDefs.branches.size_;
    (pNVar13->inlineMethodDefs).branches.disposer = structText.inlineMethodDefs.branches.disposer;
    structText.inlineMethodDefs.branches.ptr = (Branch *)0x0;
    structText.inlineMethodDefs.branches.size_ = 0;
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    (pNVar13->sourceFileDefs).size_ = structText.sourceDefs.size_;
    (pNVar13->sourceFileDefs).text.content.ptr = structText.sourceDefs.text.content.ptr;
    (pNVar13->sourceFileDefs).text.content.size_ = structText.sourceDefs.text.content.size_;
    structText.sourceDefs.text.content.ptr = (char *)0x0;
    structText.sourceDefs.text.content.size_ = 0;
    (pNVar13->sourceFileDefs).text.content.disposer = structText.sourceDefs.text.content.disposer;
    (pNVar13->sourceFileDefs).branches.ptr = structText.sourceDefs.branches.ptr;
    (pNVar13->sourceFileDefs).branches.size_ = structText.sourceDefs.branches.size_;
    (pNVar13->sourceFileDefs).branches.disposer = structText.sourceDefs.branches.disposer;
    structText.sourceDefs.branches.ptr = (Branch *)0x0;
    structText.sourceDefs.branches.size_ = 0;
    InterfaceText::~InterfaceText((InterfaceText *)&structText);
    pNVar13 = extraout_RAX_00;
    break;
  case 4:
    SVar14.raw = (RawBrandedSchema *)Schema::asConst(&schema_local);
    local_378 = SVar31.content.ptr;
    local_370 = sVar17;
    Schema::getProto(&proto_1,(Schema *)&stack0xfffffffffffffbb0);
    type = ConstSchema::getType((ConstSchema *)&stack0xfffffffffffffbb0);
    aVar21 = type.field_4;
    pAVar35 = (ArrayPtr<const_char> *)local_100;
    local_100._0_8_ = local_100._0_8_ & 0xffffffffffffff00;
    typeName((CppTypeName *)&enumerants,this,type,(Maybe<capnp::InterfaceSchema::Method> *)pAVar35);
    name_00.content.size_ = (size_t)aVar21.schema;
    name_00.content.ptr = (char *)sVar38;
    toUpperCase(&upperCase,(CapnpcCppMain *)pcVar18,name_00);
    linkage = "static ";
    if (local_370 == 1) {
      linkage = "extern ";
    }
    WVar9 = LIST;
    if (type.listDepth == '\0') {
      WVar9 = type.baseType;
    }
    params_1 = &switchD_0015f254::switchdataD_00220038;
    switch(WVar9) {
    case VOID:
    case FLOAT32:
    case FLOAT64:
      TVar30 = ConstSchema::getType((ConstSchema *)&stack0xfffffffffffffbb0);
      if (proto_1._reader.pointerCount < 5) {
        constType_3.content.size_ = 0;
        constType_3.content.disposer = (ArrayDisposer *)0x0;
        proto_1._reader.segment = (SegmentReader *)0x0;
      }
      else {
        constType_3.content.disposer = (ArrayDisposer *)(proto_1._reader.pointers + 4);
        constType_3.content.size_ = (size_t)proto_1._reader.capTable;
      }
      constType_3.content.ptr = (char *)proto_1._reader.segment;
      _::PointerReader::getStruct
                ((StructReader *)&constType_1,(PointerReader *)&constType_3,(word *)0x0);
      value_00._reader.segment._7_1_ = in_stack_fffffffffffffb8f;
      value_00._reader.segment._0_7_ = in_stack_fffffffffffffb88;
      value_00._reader.capTable = (CapTableReader *)pNVar13;
      value_00._reader.data = proto_1._reader.capTable;
      value_00._reader.pointers = (WirePointer *)this;
      value_00._reader.dataSize = (int)sVar17;
      value_00._reader.pointerCount = (short)(sVar17 >> 0x20);
      value_00._reader._38_2_ = (short)(sVar17 >> 0x30);
      value_00._reader._40_8_ = SVar14.raw;
      literalValue(&local_3c8,this,TVar30,value_00);
      kj::StringTree::flatten((String *)&result,&local_3c8);
      sVar38 = local_3c8.branches.size_;
      pBVar12 = local_3c8.branches.ptr;
      pCVar22 = extraout_RDX_01;
      if (local_3c8.branches.ptr != (Branch *)0x0) {
        local_3c8.branches.ptr = (Branch *)0x0;
        local_3c8.branches.size_ = 0;
        (**(local_3c8.branches.disposer)->_vptr_ArrayDisposer)
                  (local_3c8.branches.disposer,pBVar12,0x40,sVar38,sVar38,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
        pCVar22 = extraout_RDX_02;
      }
      sVar38 = local_3c8.text.content.size_;
      pcVar18 = local_3c8.text.content.ptr;
      if ((StringTree *)local_3c8.text.content.ptr != (StringTree *)0x0) {
        local_3c8.text.content.ptr = (char *)0x0;
        local_3c8.text.content.size_ = 0;
        (**(local_3c8.text.content.disposer)->_vptr_ArrayDisposer)
                  (local_3c8.text.content.disposer,pcVar18,1,sVar38,sVar38,0);
        pCVar22 = extraout_RDX_03;
      }
      structText.outerTypeDecl.size_ = structText.outerTypeDecl.size_ & 0xffffffffffffff00;
      constType_3.content.ptr = "static KJ_CONSTEXPR(const) ";
      constType_3.content.size_ = 0x1b;
      kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
                ((String *)&local_3c8,(kj *)&enumerants,pCVar22);
      local_140[0] = 0x20;
      constType.content.ptr = (char *)upperCase.content.size_;
      if (upperCase.content.size_ != 0) {
        constType.content.ptr = upperCase.content.ptr;
      }
      constType.content.size_ = (size_t)(upperCase.content.size_ - 1);
      if (upperCase.content.size_ == 0) {
        constType.content.size_ = (size_t)(char *)0x0;
      }
      local_328._0_8_ = " CAPNP_NON_INT_CONSTEXPR_DECL_INIT(";
      local_328._8_8_ = (ArrayDisposer *)0x23;
      local_2c8._0_8_ = result.size_;
      if (result.size_ != 0) {
        local_2c8._0_8_ = result.ptr;
      }
      local_2c8._8_8_ = (char *)(result.size_ - 1);
      if (result.size_ == 0) {
        local_2c8._8_8_ = (char *)0x0;
      }
      local_2b8._0_8_ = ");\n";
      local_2b8._8_8_ = (ArrayDisposer *)0x3;
      params_1 = (uint *)local_140;
      kj::StringTree::
      concat<kj::ArrayPtr<char_const>,kj::String,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                ((StringTree *)&structText.outerTypeDecl.text,(StringTree *)&constType_3,
                 (ArrayPtr<const_char> *)&local_3c8,(String *)local_140,
                 (FixedArray<char,_1UL> *)&constType,(ArrayPtr<const_char> *)local_328,
                 (ArrayPtr<const_char> *)local_2c8,(ArrayPtr<const_char> *)local_2b8,
                 (ArrayPtr<const_char> *)
                 CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88));
      pSVar20 = (StringTree *)local_3c8.text.content.ptr;
      sVar38 = local_3c8.size_;
      pCVar22 = extraout_RDX_04;
      if (local_3c8.size_ != 0) {
        local_3c8.size_ = 0;
        local_3c8.text.content.ptr = (char *)0x0;
        (**(code **)((Array<char> *)local_3c8.text.content.size_)->ptr)
                  (local_3c8.text.content.size_,sVar38,1,pSVar20,pSVar20,0);
        params_1 = (uint *)pSVar20;
        pCVar22 = extraout_RDX_05;
      }
      if (local_370 == 1) {
        kj::StringTree::concat<>();
      }
      else {
        constType_3.content.ptr = "KJ_CONSTEXPR(const) ";
        constType_3.content.size_ = 0x14;
        pAVar35 = (ArrayPtr<const_char> *)0x15fe68;
        kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
                  ((String *)&local_3c8,(kj *)&enumerants,pCVar22);
        constType.content.size_ = local_370 - 1;
        constType.content.ptr = local_378;
        local_328._0_8_ = upperCase.content.size_;
        if (upperCase.content.size_ != 0) {
          local_328._0_8_ = upperCase.content.ptr;
        }
        local_328._8_8_ = (ArrayDisposer *)(upperCase.content.size_ - 1);
        if (upperCase.content.size_ == 0) {
          local_328._8_8_ = (ArrayDisposer *)0x0;
        }
        local_2c8._0_8_ = " CAPNP_NON_INT_CONSTEXPR_DEF_INIT(";
        local_2c8._8_8_ = (char *)0x22;
        local_2b8._0_8_ = result.size_;
        if (result.size_ != 0) {
          local_2b8._0_8_ = result.ptr;
        }
        local_2b8._8_8_ = (ArrayDisposer *)(result.size_ - 1);
        if (result.size_ == 0) {
          local_2b8._8_8_ = (ArrayDisposer *)0x0;
        }
        local_140._0_8_ = ");\n";
        local_140._8_8_ = (char *)0x3;
        params_1 = (uint *)&stack0xfffffffffffffb8f;
        kj::StringTree::
        concat<kj::ArrayPtr<char_const>,kj::String,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                  ((StringTree *)&structText.outerTypeDef.text,(StringTree *)&constType_3,
                   (ArrayPtr<const_char> *)&local_3c8,(String *)params_1,
                   (FixedArray<char,_1UL> *)&constType,(ArrayPtr<const_char> *)local_328,
                   (ArrayPtr<const_char> *)local_2c8,(ArrayPtr<const_char> *)local_2b8,
                   (ArrayPtr<const_char> *)local_140,pAVar35);
        pSVar20 = (StringTree *)local_3c8.text.content.ptr;
        sVar38 = local_3c8.size_;
        if (local_3c8.size_ != 0) {
          local_3c8.size_ = 0;
          local_3c8.text.content.ptr = (char *)0x0;
          (**(code **)((Array<char> *)local_3c8.text.content.size_)->ptr)
                    (local_3c8.text.content.size_,sVar38,1,pSVar20,pSVar20,0);
          params_1 = (uint *)pSVar20;
        }
      }
      pSVar15 = (StringTree *)result.size_;
      pSVar20 = result.ptr;
      if (result.ptr != (StringTree *)0x0) {
        result.ptr = (StringTree *)0x0;
        result.size_ = 0;
        (**(result.disposer)->_vptr_ArrayDisposer)(result.disposer,pSVar20,1,pSVar15,pSVar15,0);
        params_1 = (uint *)pSVar15;
      }
      break;
    case BOOL:
    case INT8:
    case INT16:
    case INT32:
    case INT64:
    case UINT8:
    case UINT16:
    case UINT32:
    case UINT64:
    case ENUM:
      structText.outerTypeDecl.size_ = (ulong)structText.outerTypeDecl.size_._1_7_ << 8;
      TVar30 = ConstSchema::getType((ConstSchema *)&stack0xfffffffffffffbb0);
      if (proto_1._reader.pointerCount < 5) {
        constType_3.content.size_ = 0;
        constType_3.content.disposer = (ArrayDisposer *)0x0;
        proto_1._reader.segment = (SegmentReader *)0x0;
      }
      else {
        constType_3.content.disposer = (ArrayDisposer *)(proto_1._reader.pointers + 4);
        constType_3.content.size_ = (size_t)proto_1._reader.capTable;
      }
      constType_3.content.ptr = (char *)proto_1._reader.segment;
      _::PointerReader::getStruct
                ((StructReader *)&constType_1,(PointerReader *)&constType_3,(word *)0x0);
      value._reader.segment._7_1_ = in_stack_fffffffffffffb8f;
      value._reader.segment._0_7_ = in_stack_fffffffffffffb88;
      value._reader.capTable = (CapTableReader *)pNVar13;
      value._reader.data = proto_1._reader.capTable;
      value._reader.pointers = (WirePointer *)this;
      value._reader.dataSize = (int)sVar17;
      value._reader.pointerCount = (short)(sVar17 >> 0x20);
      value._reader._38_2_ = (short)(sVar17 >> 0x30);
      value._reader._40_8_ = SVar14.raw;
      literalValue(&local_3c8,this,TVar30,value);
      result.ptr = (StringTree *)anon_var_dwarf_83fda;
      result.size_ = 0x11;
      kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
                (&constType_3,(kj *)&enumerants,value_02);
      local_2b8[0] = 0x20;
      constType.content.ptr = (char *)upperCase.content.size_;
      if (upperCase.content.size_ != 0) {
        constType.content.ptr = upperCase.content.ptr;
      }
      constType.content.size_ = 0;
      if (upperCase.content.size_ != 0) {
        constType.content.size_ = upperCase.content.size_ - 1;
      }
      local_328._0_8_ = " = ";
      local_328._8_8_ = (ArrayDisposer *)0x3;
      local_2c8._0_8_ = ";\n";
      local_2c8._8_8_ = (char *)0x2;
      params_1 = (uint *)local_2b8;
      kj::StringTree::
      concat<kj::ArrayPtr<char_const>,kj::String,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
                ((StringTree *)&structText.outerTypeDecl.text,(StringTree *)&result,
                 (ArrayPtr<const_char> *)&constType_3,(String *)params_1,
                 (FixedArray<char,_1UL> *)&constType,(ArrayPtr<const_char> *)local_328,
                 (ArrayPtr<const_char> *)&local_3c8,(StringTree *)local_2c8,
                 (ArrayPtr<const_char> *)
                 CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88));
      pSVar20 = (StringTree *)constType_3.content.size_;
      pcVar18 = constType_3.content.ptr;
      pCVar22 = extraout_RDX;
      if (constType_3.content.ptr != (char *)0x0) {
        constType_3.content.ptr = (char *)0x0;
        constType_3.content.size_ = 0;
        (**(constType_3.content.disposer)->_vptr_ArrayDisposer)
                  (constType_3.content.disposer,pcVar18,1,pSVar20,pSVar20,0);
        params_1 = (uint *)pSVar20;
        pCVar22 = extraout_RDX_00;
      }
      if (local_370 == 1) {
        kj::StringTree::concat<>();
      }
      else {
        result.ptr = (StringTree *)anon_var_dwarf_83ff2;
        result.size_ = 0x1b;
        pAVar35 = (ArrayPtr<const_char> *)0x15fa7c;
        kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
                  (&constType_3,(kj *)&enumerants,pCVar22);
        local_2b8[0] = 0x20;
        constType.content.size_ = local_370 - 1;
        constType.content.ptr = local_378;
        local_328._0_8_ = upperCase.content.size_;
        if (upperCase.content.size_ != 0) {
          local_328._0_8_ = upperCase.content.ptr;
        }
        local_328._8_8_ = (ArrayDisposer *)0x0;
        if (upperCase.content.size_ != 0) {
          local_328._8_8_ = (ArrayDisposer *)(upperCase.content.size_ - 1);
        }
        local_2c8._0_8_ = ";\n#endif\n";
        local_2c8._8_8_ = (char *)0x9;
        params_1 = (uint *)local_2b8;
        kj::StringTree::
        concat<kj::ArrayPtr<char_const>,kj::String,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                  ((StringTree *)&structText.outerTypeDef.text,(StringTree *)&result,
                   (ArrayPtr<const_char> *)&constType_3,(String *)params_1,
                   (FixedArray<char,_1UL> *)&constType,(ArrayPtr<const_char> *)local_328,
                   (ArrayPtr<const_char> *)local_2c8,pAVar35);
        pSVar20 = (StringTree *)constType_3.content.size_;
        pcVar18 = constType_3.content.ptr;
        if (constType_3.content.ptr != (char *)0x0) {
          constType_3.content.ptr = (char *)0x0;
          constType_3.content.size_ = 0;
          (**(constType_3.content.disposer)->_vptr_ArrayDisposer)
                    (constType_3.content.disposer,pcVar18,1,pSVar20,pSVar20,0);
          params_1 = (uint *)pSVar20;
        }
      }
      pSVar20 = (StringTree *)local_3c8.branches.size_;
      pBVar12 = local_3c8.branches.ptr;
      if (local_3c8.branches.ptr != (Branch *)0x0) {
        local_3c8.branches.ptr = (Branch *)0x0;
        local_3c8.branches.size_ = 0;
        (**(local_3c8.branches.disposer)->_vptr_ArrayDisposer)
                  (local_3c8.branches.disposer,pBVar12,0x40,pSVar20,pSVar20,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
        params_1 = (uint *)pSVar20;
      }
      pSVar20 = (StringTree *)local_3c8.text.content.size_;
      pcVar18 = local_3c8.text.content.ptr;
      if ((StringTree *)local_3c8.text.content.ptr != (StringTree *)0x0) {
        local_3c8.text.content.ptr = (char *)0x0;
        local_3c8.text.content.size_ = 0;
        (**(local_3c8.text.content.disposer)->_vptr_ArrayDisposer)
                  (local_3c8.text.content.disposer,pcVar18,1,pSVar20,pSVar20,0);
        params_1 = (uint *)pSVar20;
      }
      break;
    case TEXT:
      RVar32 = ConstSchema::as<capnp::Text>((ConstSchema *)&stack0xfffffffffffffbb0);
      constType_3.content.ptr = (char *)(RVar32.super_StringPtr.content.size_ - 1);
      kj::strTree<char_const(&)[23],unsigned_long,char_const(&)[2]>
                (&local_3c8,(kj *)"::capnp::_::ConstText<",(char (*) [23])&constType_3,
                 (unsigned_long *)0x22bc7a,(char (*) [2])pAVar35);
      pacVar36 = (char (*) [3])0x16009b;
      kj::StringTree::flatten(&constType_1,&local_3c8);
      sVar38 = local_3c8.branches.size_;
      pBVar12 = local_3c8.branches.ptr;
      if (local_3c8.branches.ptr != (Branch *)0x0) {
        local_3c8.branches.ptr = (Branch *)0x0;
        local_3c8.branches.size_ = 0;
        pacVar36 = (char (*) [3])0x1600d2;
        (**(local_3c8.branches.disposer)->_vptr_ArrayDisposer)
                  (local_3c8.branches.disposer,pBVar12,0x40,sVar38,sVar38,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      sVar38 = local_3c8.text.content.size_;
      pcVar18 = local_3c8.text.content.ptr;
      if ((StringTree *)local_3c8.text.content.ptr != (StringTree *)0x0) {
        local_3c8.text.content.ptr = (char *)0x0;
        local_3c8.text.content.size_ = 0;
        pacVar36 = (char (*) [3])0x160105;
        (**(local_3c8.text.content.disposer)->_vptr_ArrayDisposer)
                  (local_3c8.text.content.disposer,pcVar18,1,sVar38,sVar38,0);
      }
      structText.outerTypeDecl.size_ = CONCAT71(structText.outerTypeDecl.size_._1_7_,1);
      result.ptr = (StringTree *)CONCAT71(result.ptr._1_7_,0x20);
      kj::strTree<char_const*&,char_const(&)[7],kj::String&,char,kj::String&,char_const(&)[3]>
                ((StringTree *)&structText.outerTypeDecl.text,(kj *)&linkage,(char **)0x221dbb,
                 (char (*) [7])&constType_1,(String *)&result,(char *)&upperCase,(String *)0x222114,
                 pacVar36);
      constType.content.ptr = (char *)CONCAT71(constType.content.ptr._1_7_,0x20);
      if (proto_1._reader.dataSize < 0x40) {
        uVar23 = 0;
      }
      else {
        uVar23 = *proto_1._reader.data;
      }
      kj::hex((CappedArray<char,_17UL> *)&local_3c8,uVar23);
      pacVar37 = (char (*) [4])0x160657;
      uVar11 = ConstSchema::getValueSchemaOffset((ConstSchema *)&stack0xfffffffffffffbb0);
      constType_3.content.ptr = (char *)CONCAT44(constType_3.content.ptr._4_4_,uVar11);
      params_1 = (uint *)&constType;
      kj::
      strTree<char_const(&)[7],kj::String&,char,kj::StringPtr&,kj::String&,char_const(&)[22],kj::CappedArray<char,17ul>,char_const(&)[10],unsigned_int,char_const(&)[4]>
                ((StringTree *)&structText.outerTypeDef.text,(kj *)0x221dbb,
                 (char (*) [7])&constType_1,(String *)params_1,(char *)&local_378,
                 (StringPtr *)&upperCase,(String *)"(::capnp::schemas::b_",(char (*) [22])&local_3c8
                 ,(CappedArray<char,_17UL> *)".words + ",(char (*) [10])&constType_3,
                 (uint *)0x222113,pacVar37);
      pSVar20 = (StringTree *)constType_1.content.size_;
      pcVar18 = constType_1.content.ptr;
      if (constType_1.content.ptr != (char *)0x0) {
        constType_1.content.ptr = (char *)0x0;
        constType_1.content.size_ = 0;
        (**(constType_1.content.disposer)->_vptr_ArrayDisposer)
                  (constType_1.content.disposer,pcVar18,1,pSVar20,pSVar20,0);
        params_1 = (uint *)pSVar20;
      }
      break;
    case DATA:
      RVar33 = ConstSchema::as<capnp::Data>((ConstSchema *)&stack0xfffffffffffffbb0);
      constType_3.content.ptr = (char *)RVar33.super_ArrayPtr<const_unsigned_char>.size_;
      kj::strTree<char_const(&)[23],unsigned_long,char_const(&)[2]>
                (&local_3c8,(kj *)"::capnp::_::ConstData<",(char (*) [23])&constType_3,
                 (unsigned_long *)0x22bc7a,(char (*) [2])pAVar35);
      pacVar36 = (char (*) [3])0x1601b3;
      kj::StringTree::flatten(&constType_1,&local_3c8);
      sVar38 = local_3c8.branches.size_;
      pBVar12 = local_3c8.branches.ptr;
      if (local_3c8.branches.ptr != (Branch *)0x0) {
        local_3c8.branches.ptr = (Branch *)0x0;
        local_3c8.branches.size_ = 0;
        pacVar36 = (char (*) [3])0x1601ea;
        (**(local_3c8.branches.disposer)->_vptr_ArrayDisposer)
                  (local_3c8.branches.disposer,pBVar12,0x40,sVar38,sVar38,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      sVar38 = local_3c8.text.content.size_;
      pcVar18 = local_3c8.text.content.ptr;
      if ((StringTree *)local_3c8.text.content.ptr != (StringTree *)0x0) {
        local_3c8.text.content.ptr = (char *)0x0;
        local_3c8.text.content.size_ = 0;
        pacVar36 = (char (*) [3])0x16021d;
        (**(local_3c8.text.content.disposer)->_vptr_ArrayDisposer)
                  (local_3c8.text.content.disposer,pcVar18,1,sVar38,sVar38,0);
      }
      structText.outerTypeDecl.size_ = CONCAT71(structText.outerTypeDecl.size_._1_7_,1);
      result.ptr = (StringTree *)CONCAT71(result.ptr._1_7_,0x20);
      kj::strTree<char_const*&,char_const(&)[7],kj::String&,char,kj::String&,char_const(&)[3]>
                ((StringTree *)&structText.outerTypeDecl.text,(kj *)&linkage,(char **)0x221dbb,
                 (char (*) [7])&constType_1,(String *)&result,(char *)&upperCase,(String *)0x222114,
                 pacVar36);
      constType.content.ptr = (char *)CONCAT71(constType.content.ptr._1_7_,0x20);
      if (proto_1._reader.dataSize < 0x40) {
        uVar23 = 0;
      }
      else {
        uVar23 = *proto_1._reader.data;
      }
      kj::hex((CappedArray<char,_17UL> *)&local_3c8,uVar23);
      pacVar37 = (char (*) [4])0x160718;
      uVar11 = ConstSchema::getValueSchemaOffset((ConstSchema *)&stack0xfffffffffffffbb0);
      constType_3.content.ptr = (char *)CONCAT44(constType_3.content.ptr._4_4_,uVar11);
      params_1 = (uint *)&constType;
      kj::
      strTree<char_const(&)[7],kj::String&,char,kj::StringPtr&,kj::String&,char_const(&)[22],kj::CappedArray<char,17ul>,char_const(&)[10],unsigned_int,char_const(&)[4]>
                ((StringTree *)&structText.outerTypeDef.text,(kj *)0x221dbb,
                 (char (*) [7])&constType_1,(String *)params_1,(char *)&local_378,
                 (StringPtr *)&upperCase,(String *)"(::capnp::schemas::b_",(char (*) [22])&local_3c8
                 ,(CappedArray<char,_17UL> *)".words + ",(char (*) [10])&constType_3,
                 (uint *)0x222113,pacVar37);
      pSVar20 = (StringTree *)constType_1.content.size_;
      pcVar18 = constType_1.content.ptr;
      if (constType_1.content.ptr != (char *)0x0) {
        constType_1.content.ptr = (char *)0x0;
        constType_1.content.size_ = 0;
        (**(constType_1.content.disposer)->_vptr_ArrayDisposer)
                  (constType_1.content.disposer,pcVar18,1,pSVar20,pSVar20,0);
        params_1 = (uint *)pSVar20;
      }
      break;
    case LIST:
      TVar30 = (Type)Type::asList(&type);
      aVar21 = TVar30.field_4;
      pSVar20 = &local_3c8;
      local_3c8.size_ = local_3c8.size_ & 0xffffffffffffff00;
      typeName((CppTypeName *)&constType_1,this,TVar30,
               (Maybe<capnp::InterfaceSchema::Method> *)pSVar20);
      local_2c8._0_8_ = "::capnp::_::ConstList<";
      local_2c8._8_8_ = (char *)0x16;
      if (local_32f == true) {
        local_328._0_8_ = "typename ";
        local_328._8_8_ = (char *)0x9;
        kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree>
                  ((StringTree *)&constType_3,(StringTree *)local_328,
                   (ArrayPtr<const_char> *)&constType_1,(StringTree *)aVar21.schema);
      }
      else {
        constType_3.content.ptr = constType_1.content.ptr;
        constType_3.content.size_ = constType_1.content.size_;
        constType_3.content.disposer = constType_1.content.disposer;
        constType_1.content.size_ = 0;
        constType_1.content.disposer = (ArrayDisposer *)0x0;
        local_410 = local_350;
        pBStack_408 = pBStack_348;
        sStack_400 = sStack_340;
        pAStack_3f8 = pAStack_338;
        pBStack_348 = (Branch *)0x0;
        sStack_340 = 0;
      }
      local_328._0_8_ = ">";
      local_328._8_8_ = (ArrayDisposer *)0x1;
      kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
                ((StringTree *)&result,(StringTree *)local_2c8,(ArrayPtr<const_char> *)&constType_3,
                 (StringTree *)local_328,(ArrayPtr<const_char> *)pSVar20);
      if (pBStack_408 != (Branch *)0x0) {
        (**pAStack_3f8->_vptr_ArrayDisposer)
                  (pAStack_3f8,pBStack_408,0x40,sStack_400,sStack_400,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      pAVar34 = constType_3.content.disposer;
      sVar38 = constType_3.content.size_;
      if (constType_3.content.size_ != 0) {
        constType_3.content.size_ = 0;
        constType_3.content.disposer = (ArrayDisposer *)0x0;
        (**(code **)*local_410)(local_410,sVar38,1,pAVar34,pAVar34,0);
      }
      pacVar36 = (char (*) [3])0x1604f5;
      kj::StringTree::flatten(&constType,(StringTree *)&result);
      if (local_2f8 != (Branch *)0x0) {
        pacVar36 = (char (*) [3])0x16052c;
        (**local_2e8->_vptr_ArrayDisposer)
                  (local_2e8,local_2f8,0x40,sStack_2f0,sStack_2f0,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      pAVar34 = result.disposer;
      sVar38 = result.size_;
      if (result.size_ != 0) {
        result.size_ = 0;
        result.disposer = (ArrayDisposer *)0x0;
        pacVar36 = (char (*) [3])0x16055f;
        (**local_300->_vptr_ArrayDisposer)(local_300,sVar38,1,pAVar34,pAVar34,0);
      }
      if (pBStack_348 != (Branch *)0x0) {
        pacVar36 = (char (*) [3])0x160596;
        (**pAStack_338->_vptr_ArrayDisposer)
                  (pAStack_338,pBStack_348,0x40,sStack_340,sStack_340,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      pAVar34 = constType_1.content.disposer;
      sVar38 = constType_1.content.size_;
      if (constType_1.content.size_ != 0) {
        constType_1.content.size_ = 0;
        constType_1.content.disposer = (ArrayDisposer *)0x0;
        pacVar36 = (char (*) [3])0x1605c9;
        (**(code **)*local_350)(local_350,sVar38,1,pAVar34,pAVar34,0);
      }
      structText.outerTypeDecl.size_ = CONCAT71(structText.outerTypeDecl.size_._1_7_,1);
      result.ptr = (StringTree *)CONCAT71(result.ptr._1_7_,0x20);
      kj::strTree<char_const*&,char_const(&)[7],kj::String&,char,kj::String&,char_const(&)[3]>
                ((StringTree *)&structText.outerTypeDecl.text,(kj *)&linkage,(char **)0x221dbb,
                 (char (*) [7])&constType,(String *)&result,(char *)&upperCase,(String *)0x222114,
                 pacVar36);
      local_328[0] = 0x20;
      if (proto_1._reader.dataSize < 0x40) {
        uVar23 = 0;
      }
      else {
        uVar23 = *proto_1._reader.data;
      }
      kj::hex((CappedArray<char,_17UL> *)&constType_1,uVar23);
      pacVar37 = (char (*) [4])0x16088e;
      uVar11 = ConstSchema::getValueSchemaOffset((ConstSchema *)&stack0xfffffffffffffbb0);
      constType_3.content.ptr = (char *)CONCAT44(constType_3.content.ptr._4_4_,uVar11);
      params_1 = (uint *)local_328;
      kj::
      strTree<char_const(&)[7],kj::String&,char,kj::StringPtr&,kj::String&,char_const(&)[22],kj::CappedArray<char,17ul>,char_const(&)[10],unsigned_int,char_const(&)[4]>
                ((StringTree *)&structText.outerTypeDef.text,(kj *)0x221dbb,(char (*) [7])&constType
                 ,(String *)params_1,(char *)&local_378,(StringPtr *)&upperCase,
                 (String *)"(::capnp::schemas::b_",(char (*) [22])&constType_1,
                 (CappedArray<char,_17UL> *)".words + ",(char (*) [10])&constType_3,(uint *)0x222113
                 ,pacVar37);
      pSVar20 = (StringTree *)constType.content.size_;
      pcVar18 = constType.content.ptr;
      if (constType.content.ptr != (char *)0x0) {
        constType.content.ptr = (char *)0x0;
        constType.content.size_ = 0;
        (**(constType.content.disposer)->_vptr_ArrayDisposer)
                  (constType.content.disposer,pcVar18,1,pSVar20,pSVar20,0);
        params_1 = (uint *)pSVar20;
      }
      break;
    case STRUCT:
      result.ptr = (StringTree *)anon_var_dwarf_84076;
      result.size_ = 0x18;
      kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
                (&constType_1,(kj *)&enumerants,value_01);
      constType.content.ptr = ">";
      constType.content.size_ = 1;
      kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>>
                (&local_3c8,(StringTree *)&result,(ArrayPtr<const_char> *)&constType_1,&constType,
                 pAVar35);
      sVar38 = constType_1.content.size_;
      pcVar18 = constType_1.content.ptr;
      if (constType_1.content.ptr != (char *)0x0) {
        constType_1.content.ptr = (char *)0x0;
        constType_1.content.size_ = 0;
        (**(constType_1.content.disposer)->_vptr_ArrayDisposer)
                  (constType_1.content.disposer,pcVar18,1,sVar38,sVar38,0);
      }
      pacVar36 = (char (*) [3])0x160337;
      kj::StringTree::flatten(&constType_3,&local_3c8);
      sVar38 = local_3c8.branches.size_;
      pBVar12 = local_3c8.branches.ptr;
      if (local_3c8.branches.ptr != (Branch *)0x0) {
        local_3c8.branches.ptr = (Branch *)0x0;
        local_3c8.branches.size_ = 0;
        pacVar36 = (char (*) [3])0x16036e;
        (**(local_3c8.branches.disposer)->_vptr_ArrayDisposer)
                  (local_3c8.branches.disposer,pBVar12,0x40,sVar38,sVar38,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      sVar38 = local_3c8.text.content.size_;
      pcVar18 = local_3c8.text.content.ptr;
      if ((StringTree *)local_3c8.text.content.ptr != (StringTree *)0x0) {
        local_3c8.text.content.ptr = (char *)0x0;
        local_3c8.text.content.size_ = 0;
        pacVar36 = (char (*) [3])0x1603a1;
        (**(local_3c8.text.content.disposer)->_vptr_ArrayDisposer)
                  (local_3c8.text.content.disposer,pcVar18,1,sVar38,sVar38,0);
      }
      structText.outerTypeDecl.size_ = CONCAT71(structText.outerTypeDecl.size_._1_7_,1);
      result.ptr = (StringTree *)CONCAT71(result.ptr._1_7_,0x20);
      kj::strTree<char_const*&,char_const(&)[7],kj::String&,char,kj::String&,char_const(&)[3]>
                ((StringTree *)&structText.outerTypeDecl.text,(kj *)&linkage,(char **)0x221dbb,
                 (char (*) [7])&constType_3,(String *)&result,(char *)&upperCase,(String *)0x222114,
                 pacVar36);
      constType.content.ptr = (char *)CONCAT71(constType.content.ptr._1_7_,0x20);
      if (proto_1._reader.dataSize < 0x40) {
        uVar23 = 0;
      }
      else {
        uVar23 = *proto_1._reader.data;
      }
      kj::hex((CappedArray<char,_17UL> *)&local_3c8,uVar23);
      pacVar37 = (char (*) [4])0x1607d9;
      uVar11 = ConstSchema::getValueSchemaOffset((ConstSchema *)&stack0xfffffffffffffbb0);
      constType_1.content.ptr = (char *)CONCAT44(constType_1.content.ptr._4_4_,uVar11);
      params_1 = (uint *)&constType;
      kj::
      strTree<char_const(&)[7],kj::String&,char,kj::StringPtr&,kj::String&,char_const(&)[22],kj::CappedArray<char,17ul>,char_const(&)[10],unsigned_int,char_const(&)[4]>
                ((StringTree *)&structText.outerTypeDef.text,(kj *)0x221dbb,
                 (char (*) [7])&constType_3,(String *)params_1,(char *)&local_378,
                 (StringPtr *)&upperCase,(String *)"(::capnp::schemas::b_",(char (*) [22])&local_3c8
                 ,(CappedArray<char,_17UL> *)".words + ",(char (*) [10])&constType_1,
                 (uint *)0x222113,pacVar37);
      pSVar20 = (StringTree *)constType_3.content.size_;
      pcVar18 = constType_3.content.ptr;
      if (constType_3.content.ptr != (char *)0x0) {
        constType_3.content.ptr = (char *)0x0;
        constType_3.content.size_ = 0;
        (**(constType_3.content.disposer)->_vptr_ArrayDisposer)
                  (constType_3.content.disposer,pcVar18,1,pSVar20,pSVar20,0);
        params_1 = (uint *)pSVar20;
      }
      break;
    case INTERFACE:
    case ANY_POINTER:
      structText.outerTypeDecl.size_ = (ulong)structText.outerTypeDecl.size_._1_7_ << 8;
      kj::StringTree::concat<>();
      kj::StringTree::concat<>();
      break;
    default:
      kj::_::unreachable();
    }
    pSVar20 = (StringTree *)upperCase.content.size_;
    pcVar18 = upperCase.content.ptr;
    if (upperCase.content.ptr != (char *)0x0) {
      upperCase.content.ptr = (char *)0x0;
      upperCase.content.size_ = 0;
      (**(upperCase.content.disposer)->_vptr_ArrayDisposer)
                (upperCase.content.disposer,pcVar18,1,pSVar20,pSVar20,0);
      params_1 = (uint *)pSVar20;
    }
    pSVar20 = (StringTree *)enumerants.list.reader._32_8_;
    uVar7 = enumerants.list.reader._24_8_;
    if (enumerants.list.reader._24_8_ != 0) {
      enumerants.list.reader.elementCount = 0;
      enumerants.list.reader.step = 0;
      enumerants.list.reader.structDataSize = 0;
      enumerants.list.reader.structPointerCount = 0;
      enumerants.list.reader.elementSize = VOID;
      enumerants.list.reader._39_1_ = 0;
      (*(code *)**(undefined8 **)enumerants.list.reader._40_8_)
                (enumerants.list.reader._40_8_,uVar7,0x40,pSVar20,pSVar20,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      params_1 = (uint *)pSVar20;
    }
    pSVar20 = (StringTree *)enumerants.list.reader.capTable;
    pSVar6 = enumerants.list.reader.segment;
    if (enumerants.list.reader.segment != (SegmentReader *)0x0) {
      enumerants.list.reader.segment = (SegmentReader *)0x0;
      enumerants.list.reader.capTable = (CapTableReader *)0x0;
      (*(code *)**(undefined8 **)enumerants.list.reader.ptr)
                (enumerants.list.reader.ptr,pSVar6,1,pSVar20,pSVar20,0);
      params_1 = (uint *)pSVar20;
    }
    if (sVar17 == 1) {
      kj::StringTree::concat<>();
      (pNVar13->outerTypeDef).size_ = (size_t)structText.outerTypeDecl.text.content.ptr;
      (pNVar13->outerTypeDef).text.content.ptr = (char *)structText.outerTypeDecl.text.content.size_
      ;
      (pNVar13->outerTypeDef).text.content.size_ =
           (size_t)structText.outerTypeDecl.text.content.disposer;
      structText.outerTypeDecl.text.content.size_ = 0;
      structText.outerTypeDecl.text.content.disposer = (ArrayDisposer *)0x0;
      (pNVar13->outerTypeDef).text.content.disposer =
           (ArrayDisposer *)structText.outerTypeDecl.branches.ptr;
      (pNVar13->outerTypeDef).branches.ptr = (Branch *)structText.outerTypeDecl.branches.size_;
      (pNVar13->outerTypeDef).branches.size_ = (size_t)structText.outerTypeDecl.branches.disposer;
      (pNVar13->outerTypeDef).branches.disposer = (ArrayDisposer *)structText.outerTypeDef.size_;
      structText.outerTypeDecl.branches.size_ = 0;
      structText.outerTypeDecl.branches.disposer = (ArrayDisposer *)0x0;
    }
    else {
      local_100._0_8_ = "  ";
      local_100._8_8_ = (char *)0x2;
      kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree>
                (&pNVar13->outerTypeDecl,(StringTree *)local_100,
                 (ArrayPtr<const_char> *)&structText.outerTypeDecl.text,(StringTree *)params_1);
      kj::StringTree::concat<>();
    }
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    (pNVar13->sourceFileDefs).size_ = (size_t)structText.outerTypeDef.text.content.ptr;
    (pNVar13->sourceFileDefs).text.content.ptr = (char *)structText.outerTypeDef.text.content.size_;
    (pNVar13->sourceFileDefs).text.content.size_ =
         (size_t)structText.outerTypeDef.text.content.disposer;
    structText.outerTypeDef.text.content.size_ = 0;
    structText.outerTypeDef.text.content.disposer = (ArrayDisposer *)0x0;
    (pNVar13->sourceFileDefs).text.content.disposer =
         (ArrayDisposer *)structText.outerTypeDef.branches.ptr;
    (pNVar13->sourceFileDefs).branches.ptr = (Branch *)structText.outerTypeDef.branches.size_;
    (pNVar13->sourceFileDefs).branches.size_ = (size_t)structText.outerTypeDef.branches.disposer;
    (pNVar13->sourceFileDefs).branches.disposer =
         (ArrayDisposer *)structText.readerBuilderDefs.size_;
    structText.outerTypeDef.branches.size_ = 0;
    structText.outerTypeDef.branches.disposer = (ArrayDisposer *)0x0;
    ConstText::~ConstText((ConstText *)&structText);
    pNVar13 = extraout_RAX_01;
    break;
  case 5:
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    pNVar13 = (NodeText *)kj::StringTree::concat<>();
    break;
  default:
    kj::_::unreachable();
  }
  return pNVar13;
}

Assistant:

NodeText makeNodeTextWithoutNested(kj::StringPtr namespace_, kj::StringPtr scope,
                                     kj::StringPtr name, Schema schema,
                                     kj::Array<kj::StringTree> nestedTypeDecls,
                                     const TemplateContext& templateContext) {
    auto proto = schema.getProto();
    KJ_IF_MAYBE(annotatedName, annotationValue(proto, NAME_ANNOTATION_ID)) {
      name = annotatedName->getText();
    }
    auto hexId = kj::hex(proto.getId());

    switch (proto.which()) {
      case schema::Node::FILE:
        KJ_FAIL_REQUIRE("This method shouldn't be called on file nodes.");

      case schema::Node::STRUCT: {
        StructText structText =
            makeStructText(scope, name, schema.asStruct(), kj::mv(nestedTypeDecls),
                           templateContext);

        return NodeText {
          kj::mv(structText.outerTypeDecl),
          kj::mv(structText.outerTypeDef),
          kj::mv(structText.readerBuilderDefs),
          kj::mv(structText.inlineMethodDefs),

          kj::strTree(),
          kj::strTree(),

          kj::mv(structText.sourceDefs),
        };
      }

      case schema::Node::ENUM: {
        auto enumerants = schema.asEnum().getEnumerants();

        return NodeText {
          scope.size() == 0 ? kj::strTree() : kj::strTree(
              "  typedef ::capnp::schemas::", name, "_", hexId, " ", name, ";\n"
              "\n"),

          scope.size() > 0 ? kj::strTree() : kj::strTree(
              "typedef ::capnp::schemas::", name, "_", hexId, " ", name, ";\n"
              "\n"),

          kj::strTree(),
          kj::strTree(),

          kj::strTree(
              // We declare enums in the capnp::schemas namespace and then typedef them into
              // place because we don't want them to be parameterized for generics.
              "enum class ", name, "_", hexId, ": uint16_t {\n",
              KJ_MAP(e, enumerants) {
                return kj::strTree("  ", toUpperCase(protoName(e.getProto())), ",\n");
              },
              "};\n"
              "CAPNP_DECLARE_ENUM(", name, ", ", hexId, ");\n"),
          kj::strTree(
              "CAPNP_DEFINE_ENUM(", name, "_", hexId, ", ", hexId, ");\n"),

          kj::strTree(),
        };
      }

      case schema::Node::INTERFACE: {
        hasInterfaces = true;

        InterfaceText interfaceText =
            makeInterfaceText(scope, name, schema.asInterface(), kj::mv(nestedTypeDecls),
                              templateContext);

        return NodeText {
          kj::mv(interfaceText.outerTypeDecl),
          kj::mv(interfaceText.outerTypeDef),
          kj::mv(interfaceText.clientServerDefs),
          kj::mv(interfaceText.inlineMethodDefs),

          kj::strTree(),
          kj::strTree(),

          kj::mv(interfaceText.sourceDefs),
        };
      }

      case schema::Node::CONST: {
        auto constText = makeConstText(scope, name, schema.asConst(), templateContext);

        return NodeText {
          scope.size() == 0 ? kj::strTree() : kj::strTree("  ", kj::mv(constText.decl)),
          scope.size() > 0 ? kj::strTree() : kj::mv(constText.decl),
          kj::strTree(),
          kj::strTree(),

          kj::strTree(),
          kj::strTree(),

          kj::mv(constText.def),
        };
      }

      case schema::Node::ANNOTATION: {
        return NodeText {
          kj::strTree(),
          kj::strTree(),
          kj::strTree(),
          kj::strTree(),

          kj::strTree(),
          kj::strTree(),

          kj::strTree(),
        };
      }
    }

    KJ_UNREACHABLE;
  }